

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tx.c
# Opt level: O0

int main(void)

{
  _Bool _Var1;
  _Bool tests_ok;
  
  _Var1 = test_tx_parse();
  if (!_Var1) {
    printf("test_tx_parse test_tx() test failed!\n");
  }
  return (uint)!_Var1;
}

Assistant:

int main(void)
{
    bool tests_ok = true;

#define RUN(t) if (!t()) { printf(#t " test_tx() test failed!\n"); tests_ok = false; }

    RUN(test_tx_parse);

    return tests_ok ? 0 : 1;
}